

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_writer.h
# Opt level: O0

void __thiscall tcmalloc::GenericWriter::GenericWriter(GenericWriter *this)

{
  GenericWriter *this_local;
  
  this->_vptr_GenericWriter = (_func_int **)&PTR__GenericWriter_00146aa0;
  this->buf_ = (char *)0x0;
  this->buf_fill_ = (char *)0x0;
  this->buf_end_ = (char *)0x0;
  return;
}

Assistant:

class ATTRIBUTE_VISIBILITY_HIDDEN GenericWriter {
public:
#if defined(HAVE___ATTRIBUTE__)
  void AppendF(const char* fmt, ...) __attribute__ ((format(printf, 2, 3)));
#else
  void AppendF(const char* fmt, ...);
#endif

  void AppendMem(const char* str, size_t sz);
  void AppendStr(const char* str) {
    AppendMem(str, strlen(str));
  }

protected:
  virtual ~GenericWriter();

  virtual std::pair<char*, char*> RecycleBuffer(char* buf_begin, char* buf_end, int want_at_least) = 0;

  // Must be called by child's destructor
  void FinalRecycle() {
    RecycleBuffer(buf_, buf_fill_, 0);
    buf_fill_ = buf_;
  }

private:
  char* buf_{};
  char* buf_fill_{};
  char* buf_end_{};
}